

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptor::CopySourceCodeInfoTo
          (FileDescriptor *this,FileDescriptorProto *proto)

{
  SourceCodeInfo *pSVar1;
  SourceCodeInfo *pSVar2;
  FileDescriptorProto *proto_local;
  FileDescriptor *this_local;
  
  if (this->source_code_info_ != (SourceCodeInfo *)0x0) {
    pSVar1 = this->source_code_info_;
    pSVar2 = SourceCodeInfo::default_instance();
    if (pSVar1 != pSVar2) {
      pSVar1 = this->source_code_info_;
      pSVar2 = FileDescriptorProto::mutable_source_code_info(proto);
      SourceCodeInfo::operator=(pSVar2,pSVar1);
    }
  }
  return;
}

Assistant:

void FileDescriptor::CopySourceCodeInfoTo(FileDescriptorProto* proto) const {
  if (source_code_info_ &&
      source_code_info_ != &SourceCodeInfo::default_instance()) {
    *proto->mutable_source_code_info() = *source_code_info_;
  }
}